

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O2

void select_all_cb(Fl_Widget *param_1,void *param_2)

{
  Fl_Type *t;
  Fl_Type *pFVar1;
  Fl_Type *p;
  fd_set *in_R8;
  timeval *in_R9;
  Fl_Type **ppFVar2;
  bool bVar3;
  
  if (Fl_Type::current == (Fl_Type *)0x0) {
    p = (Fl_Type *)0x0;
  }
  else {
    p = Fl_Type::current->parent;
  }
  pFVar1 = p;
  if (in_this_only != (Fl_Type *)0x0) {
    for (; (pFVar1 != (Fl_Type *)0x0 && (pFVar1 != in_this_only)); pFVar1 = pFVar1->parent) {
    }
    if (pFVar1 != in_this_only) {
      p = in_this_only;
    }
  }
  for (; p != (Fl_Type *)0x0; p = p->parent) {
    bVar3 = true;
    pFVar1 = p;
    while ((pFVar1 = pFVar1->next, pFVar1 != (Fl_Type *)0x0 && (p->level < pFVar1->level))) {
      if (pFVar1->new_selected == '\0') {
        bVar3 = false;
        Fl_Browser_::select(&widget_browser->super_Fl_Browser_,(int)pFVar1,(fd_set *)&DAT_00000001,
                            (fd_set *)0x0,in_R8,in_R9);
      }
    }
    if (!bVar3) goto LAB_001824ee;
  }
  p = (Fl_Type *)0x0;
  ppFVar2 = &Fl_Type::first;
  while (pFVar1 = *ppFVar2, pFVar1 != (Fl_Type *)0x0) {
    Fl_Browser_::select(&widget_browser->super_Fl_Browser_,(int)pFVar1,(fd_set *)&DAT_00000001,
                        (fd_set *)0x0,in_R8,in_R9);
    ppFVar2 = &pFVar1->next;
  }
LAB_001824ee:
  selection_changed(p);
  return;
}

Assistant:

void select_all_cb(Fl_Widget *,void *) {
  Fl_Type *p = Fl_Type::current ? Fl_Type::current->parent : 0;
  if (in_this_only) {
    Fl_Type *t = p;
    for (; t && t != in_this_only; t = t->parent) {/*empty*/}
    if (t != in_this_only) p = in_this_only;
  }
  for (;;) {
    if (p) {
      int foundany = 0;
      for (Fl_Type *t = p->next; t && t->level>p->level; t = t->next) {
	if (!t->new_selected) {widget_browser->select(t,1,0); foundany = 1;}
      }
      if (foundany) break;
      p = p->parent;
    } else {
      for (Fl_Type *t = Fl_Type::first; t; t = t->next)
	widget_browser->select(t,1,0);
      break;
    }
  }
  selection_changed(p);
}